

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

PtrTokenOrSyntax * __thiscall
slang::syntax::HierarchyInstantiationSyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,HierarchyInstantiationSyntax *this,size_t index)

{
  PtrTokenOrSyntax *pPVar1;
  
  switch(this) {
  case (HierarchyInstantiationSyntax *)0x0:
    pPVar1 = __return_storage_ptr__ + 2;
    break;
  case (HierarchyInstantiationSyntax *)0x1:
    return __return_storage_ptr__ + 5;
  case (HierarchyInstantiationSyntax *)0x2:
    pPVar1 = *(PtrTokenOrSyntax **)
              &__return_storage_ptr__[6].
               super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>;
    break;
  case (HierarchyInstantiationSyntax *)0x3:
    pPVar1 = __return_storage_ptr__ + 7;
    break;
  case (HierarchyInstantiationSyntax *)0x4:
    return __return_storage_ptr__ + 10;
  default:
    return (PtrTokenOrSyntax *)0x0;
  }
  return pPVar1;
}

Assistant:

PtrTokenOrSyntax HierarchyInstantiationSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return &type;
        case 2: return parameters;
        case 3: return &instances;
        case 4: return &semi;
        default: return nullptr;
    }
}